

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bucketaccum.hpp
# Opt level: O0

QuadTerms * __thiscall
mp::BucketAccum1Type<mp::QuadTerms>::ExtractBucket(BucketAccum1Type<mp::QuadTerms> *this,size_t i)

{
  QuadTerms *in_RDI;
  QuadTerms *result;
  QuadTerms *this_00;
  
  this_00 = in_RDI;
  std::array<mp::QuadTerms,_64UL>::at((array<mp::QuadTerms,_64UL> *)in_RDI,(size_type)in_RDI);
  QuadTerms::QuadTerms(this_00,in_RDI);
  std::array<mp::QuadTerms,_64UL>::operator[]
            ((array<mp::QuadTerms,_64UL> *)this_00,(size_type)in_RDI);
  QuadTerms::clear(this_00);
  return in_RDI;
}

Assistant:

Body BucketAccum1Type<Body>::ExtractBucket(size_t i) {
  Body result = std::move(buckets_.at(i));
  buckets_[i].clear();            // std::move does not
  return result;
}